

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

Expr * __thiscall Parser::primary_expression(Parser *this)

{
  TokenKind TVar1;
  uint uVar2;
  ulong uVar3;
  Expr *pEVar4;
  long lVar5;
  pointer *__ptr;
  Expr *local_38;
  string local_30;
  
  TVar1 = this->tok->kind;
  if (TVar1 == NumericConstant) {
    std::make_unique<Literal>();
    LexData::id_text_abi_cxx11_(&local_30,this->lex_data,this->tok);
    lVar5 = strtol(local_30._M_dataplus._M_p,(char **)0x0,0);
    *(int *)&(local_38->super_Node).field_0xc = (int)lVar5;
    std::__cxx11::string::~string((string *)&local_30);
    next_token(this);
    return local_38;
  }
  if (TVar1 == Punctuator) {
    uVar2 = this->tok->i;
    uVar3 = (ulong)uVar2;
    if (uVar3 < 0x2e) {
      if ((0x2c4200000000U >> (uVar3 & 0x3f) & 1) == 0) {
        if (uVar3 == 0x28) {
          next_token(this);
          pEVar4 = additive_expression(this);
          if ((this->tok->kind != Punctuator) || (this->tok->i != 0x29)) {
            error<char_const(&)[34]>(this,(char (*) [34])"expected \')\' to finish expression");
          }
          next_token(this);
          return pEVar4;
        }
        goto LAB_0010d5e5;
      }
    }
    else {
LAB_0010d5e5:
      if (uVar2 != 0x7e) goto LAB_0010d5ee;
    }
    std::make_unique<UnaryExpr>();
    local_30._M_dataplus._M_p[0xc] = (char)this->tok->i;
    next_token(this);
    pEVar4 = primary_expression(this);
    (((Expr *)(local_30._M_dataplus._M_p + 0x10))->super_Node)._vptr_Node = (_func_int **)pEVar4;
    if (pEVar4 == (Expr *)0x0) {
      error<char_const(&)[38]>(this,(char (*) [38])"expected primary expression after \'-\'");
    }
  }
  else {
LAB_0010d5ee:
    local_30._M_dataplus._M_p = (pointer)0x0;
  }
  return (Expr *)local_30._M_dataplus._M_p;
}

Assistant:

Expr* Parser::primary_expression()
{
  if (is_punctuator('(')) {
    next_token();               // Skip '('
    std::unique_ptr<Expr> e(expression());
    if (!is_punctuator(')'))
      error("expected ')' to finish expression");
    next_token();
    return e.release();
  }
  else if (is_punctuator('*') ||
           is_punctuator('&') ||
           is_punctuator('+') ||
           is_punctuator('-') ||
           is_punctuator('!') ||
           is_punctuator('~')) {
    auto be = std::make_unique<UnaryExpr>();
    be->op = tok->i;
    next_token();
    be->operand = primary_expression();
    if (!be->operand)
      error("expected primary expression after '-'");
    return be.release();
  }
  else if (is(TokenKind::NumericConstant)) {
    auto l = std::make_unique<Literal>();
    l->value = std::strtol(lex_data->id_text(*tok).c_str(), nullptr, 0);
    next_token();
    return l.release();
  }
  return nullptr;
}